

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::CheckForInstantiations
          (TypeParameterizedTestSuiteRegistry *this)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  *__k;
  _Rb_tree_color _Var1;
  char *__s;
  _func_int **pp_Var2;
  const_iterator cVar3;
  long *plVar4;
  TestFactoryBase *factory;
  _Base_ptr p_Var5;
  size_type *psVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  undefined1 *local_1b8;
  _func_int **local_1b0;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  _func_int **pp_Stack_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  local_198;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_148;
  _Rb_tree_node_base *local_140;
  _Base_ptr local_138;
  size_type *local_130;
  string full_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  local_f0;
  size_type *local_a0;
  string message;
  long local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  CodeLocation local_60;
  allocator<char> local_31;
  
  UnitTest::GetInstance();
  p_Var5 = (this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != p_Var7) {
    local_148 = &(UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_;
    p_Var8 = &((UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_)._M_t.
              _M_impl.super__Rb_tree_header._M_header;
    local_140 = p_Var7;
    local_138 = p_Var8;
    do {
      if (*(char *)&p_Var5[3]._M_parent == '\0') {
        __k = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
               *)(p_Var5 + 1);
        cVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_148->_M_t,(key_type *)__k);
        if (cVar3._M_node == p_Var8) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (message.field_2._M_local_buf + 8),"Type parameterized test suite ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          plVar4 = (long *)std::__cxx11::string::append(message.field_2._M_local_buf + 8);
          local_60.file._M_dataplus._M_p = (pointer)&local_60.file.field_2;
          psVar6 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_60.file.field_2._M_allocated_capacity = *psVar6;
            local_60.file.field_2._8_8_ = plVar4[3];
          }
          else {
            local_60.file.field_2._M_allocated_capacity = *psVar6;
            local_60.file._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_60.file._M_string_length = plVar4[1];
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_60,*(ulong *)(p_Var5 + 1))
          ;
          full_name.field_2._8_8_ = &local_100;
          psVar6 = (size_type *)(plVar4 + 2);
          if ((size_type *)*plVar4 == psVar6) {
            local_100._M_allocated_capacity = *psVar6;
            local_100._8_8_ = plVar4[3];
          }
          else {
            local_100._M_allocated_capacity = *psVar6;
            full_name.field_2._8_8_ = (size_type *)*plVar4;
          }
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append(full_name.field_2._M_local_buf + 8);
          local_a0 = &message._M_string_length;
          psVar6 = (size_type *)(plVar4 + 2);
          if ((size_type *)*plVar4 == psVar6) {
            message._M_string_length = *psVar6;
            message.field_2._M_allocated_capacity = plVar4[3];
          }
          else {
            message._M_string_length = *psVar6;
            local_a0 = (size_type *)*plVar4;
          }
          message._M_dataplus._M_p = (pointer)plVar4[1];
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)full_name.field_2._8_8_ != &local_100) {
            operator_delete((void *)full_name.field_2._8_8_,local_100._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60.file._M_dataplus._M_p != &local_60.file.field_2) {
            operator_delete(local_60.file._M_dataplus._M_p,
                            local_60.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)message.field_2._8_8_ != &local_70) {
            operator_delete((void *)message.field_2._8_8_,local_70._M_allocated_capacity + 1);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (full_name.field_2._M_local_buf + 8),
                         "UninstantiatedTypeParameterizedTestSuite<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          plVar4 = (long *)std::__cxx11::string::append(full_name.field_2._M_local_buf + 8);
          local_130 = &full_name._M_string_length;
          psVar6 = (size_type *)(plVar4 + 2);
          if ((size_type *)*plVar4 == psVar6) {
            full_name._M_string_length = *psVar6;
            full_name.field_2._M_allocated_capacity = plVar4[3];
          }
          else {
            full_name._M_string_length = *psVar6;
            local_130 = (size_type *)*plVar4;
          }
          full_name._M_dataplus._M_p = (pointer)plVar4[1];
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)full_name.field_2._8_8_ != &local_100) {
            operator_delete((void *)full_name.field_2._8_8_,local_100._M_allocated_capacity + 1);
          }
          psVar6 = local_130;
          __s = *(char **)(p_Var5 + 2);
          _Var1 = p_Var5[3]._M_color;
          local_1b8 = &local_1a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,local_a0,message._M_dataplus._M_p + (long)local_a0);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair(&local_198,__k);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(message.field_2._M_local_buf + 8),__s,&local_31);
          local_60.file._M_dataplus._M_p = (pointer)&local_60.file.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,message.field_2._8_8_,local_78 + message.field_2._8_8_);
          local_60.line = _Var1;
          factory = (TestFactoryBase *)operator_new(0x78);
          pp_Var2 = local_1b0;
          if (local_1b8 == &local_1a8) {
            local_100._8_8_ = pp_Stack_1a0;
            full_name.field_2._8_8_ = &local_100;
          }
          else {
            full_name.field_2._8_8_ = local_1b8;
          }
          local_100._M_allocated_capacity._1_7_ = uStack_1a7;
          local_100._M_local_buf[0] = local_1a8;
          local_1b0 = (_func_int **)0x0;
          local_1a8 = 0;
          local_1b8 = &local_1a8;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair(&local_f0,&local_198);
          factory->_vptr_TestFactoryBase =
               (_func_int **)
               (
               _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal34TypeParameterizedTestSuiteRegistry22CheckForInstantiationsEvE3__0EEPNS_8TestInfoEPKcS8_S8_S8_S8_iT0_E11FactoryImpl
               + 0x10);
          factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)full_name.field_2._8_8_ == &local_100) {
            factory[3]._vptr_TestFactoryBase = (_func_int **)local_100._M_allocated_capacity;
            factory[4]._vptr_TestFactoryBase = (_func_int **)local_100._8_8_;
          }
          else {
            factory[1]._vptr_TestFactoryBase = (_func_int **)full_name.field_2._8_8_;
            factory[3]._vptr_TestFactoryBase = (_func_int **)local_100._M_allocated_capacity;
          }
          factory[2]._vptr_TestFactoryBase = pp_Var2;
          local_100._M_allocated_capacity = local_100._M_allocated_capacity & 0xffffffffffffff00;
          full_name.field_2._8_8_ = &local_100;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
                  *)(factory + 5),&local_f0);
          MakeAndRegisterTestInfo
                    ("GoogleTestVerification",(char *)psVar6,(char *)0x0,(char *)0x0,&local_60,
                     &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
                     (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
          p_Var8 = local_138;
          p_Var7 = local_140;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0.second.code_location.file._M_dataplus._M_p !=
              &local_f0.second.code_location.file.field_2) {
            operator_delete(local_f0.second.code_location.file._M_dataplus._M_p,
                            local_f0.second.code_location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0.first._M_dataplus._M_p != &local_f0.first.field_2) {
            operator_delete(local_f0.first._M_dataplus._M_p,
                            local_f0.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)full_name.field_2._8_8_ != &local_100) {
            operator_delete((void *)full_name.field_2._8_8_,local_100._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60.file._M_dataplus._M_p != &local_60.file.field_2) {
            operator_delete(local_60.file._M_dataplus._M_p,
                            local_60.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)message.field_2._8_8_ != &local_70) {
            operator_delete((void *)message.field_2._8_8_,local_70._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198.second.code_location.file._M_dataplus._M_p !=
              &local_198.second.code_location.file.field_2) {
            operator_delete(local_198.second.code_location.file._M_dataplus._M_p,
                            local_198.second.code_location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198.first._M_dataplus._M_p != &local_198.first.field_2) {
            operator_delete(local_198.first._M_dataplus._M_p,
                            local_198.first.field_2._M_allocated_capacity + 1);
          }
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
          }
          if (local_130 != &full_name._M_string_length) {
            operator_delete(local_130,full_name._M_string_length + 1);
          }
          if (local_a0 != &message._M_string_length) {
            operator_delete(local_a0,message._M_string_length + 1);
          }
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != p_Var7);
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::CheckForInstantiations() {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  for (const auto& testcase : suites_) {
    if (testcase.second.instantiated) continue;
    if (ignored.find(testcase.first) != ignored.end()) continue;

    std::string message =
        "Type parameterized test suite " + testcase.first +
        " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated "
        "via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run."
        "\n\n"
        "Ideally, TYPED_TEST_P definitions should only ever be included as "
        "part of binaries that intend to use them. (As opposed to, for "
        "example, being placed in a library that may be linked in to get other "
        "utilities.)"
        "\n\n"
        "To suppress this error for this test suite, insert the following line "
        "(in a non-header) in the namespace it is defined in:"
        "\n\n"
        "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
        testcase.first + ");";

    std::string full_name =
        "UninstantiatedTypeParameterizedTestSuite<" + testcase.first + ">";
    RegisterTest(  //
        "GoogleTestVerification", full_name.c_str(),
        nullptr,  // No type parameter.
        nullptr,  // No value parameter.
        testcase.second.code_location.file.c_str(),
        testcase.second.code_location.line, [message, testcase] {
          return new FailureTest(testcase.second.code_location, message,
                                 kErrorOnUninstantiatedTypeParameterizedTest);
        });
  }
}